

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall cmLocalGenerator::GenerateInstallRules(cmLocalGenerator *this)

{
  Snapshot *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  string *psVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  long *plVar9;
  ostream *poVar10;
  undefined4 uVar11;
  string *unaff_RBP;
  undefined7 uVar13;
  pointer ppcVar12;
  undefined **ppuVar14;
  char *pcVar15;
  pointer ppcVar16;
  char *__end;
  string odir;
  string default_config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  string homedir;
  string file;
  cmGeneratedFileStream fout;
  undefined1 auStack_358 [8];
  cmLocalGenerator *local_350;
  allocator local_341;
  string local_340;
  char *local_320;
  long *local_318;
  long local_310;
  long local_308 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  long *local_2d8;
  size_t local_2d0;
  long local_2c8 [2];
  long *local_2b8;
  size_t local_2b0;
  long local_2a8 [2];
  string local_298;
  undefined1 local_278 [584];
  
  pcVar3 = this->Makefile;
  pcVar2 = local_278 + 0x10;
  local_350 = this;
  local_278._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"CMAKE_INSTALL_PREFIX","");
  pcVar7 = cmMakefile::GetDefinition(pcVar3,(string *)local_278);
  if ((pointer)local_278._0_8_ != pcVar2) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  pcVar15 = "/usr/local";
  if (pcVar7 != (char *)0x0) {
    pcVar15 = pcVar7;
  }
  pcVar3 = local_350->Makefile;
  local_278._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"CMAKE_STAGING_PREFIX","");
  pcVar7 = cmMakefile::GetDefinition(pcVar3,(string *)local_278);
  if ((pointer)local_278._0_8_ != pcVar2) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  if (pcVar7 != (char *)0x0) {
    pcVar15 = pcVar7;
  }
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_298,local_350->Makefile,&local_2f8,false);
  local_318 = local_308;
  local_320 = pcVar15;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_318,local_298._M_dataplus._M_p,
             local_298._M_dataplus._M_p + local_298._M_string_length);
  if (local_310 == 0) {
    ppuVar14 = &PTR_anon_var_dwarf_23ddbd_005b6dc0;
    psVar4 = local_2f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      while (unaff_RBP = psVar4,
            unaff_RBP !=
            local_2f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
        cmsys::SystemTools::UpperCase((string *)local_278,unaff_RBP);
        iVar6 = std::__cxx11::string::compare((char *)local_278);
        if ((pointer)local_278._0_8_ != pcVar2) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
        if (iVar6 == 0) {
          std::__cxx11::string::_M_assign((string *)&local_318);
        }
        psVar4 = unaff_RBP + 1;
      }
    } while ((ppuVar14[1] != (undefined *)0x0) &&
            (ppuVar14 = ppuVar14 + 1,
            psVar4 = local_2f8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start, local_310 == 0));
  }
  if ((local_310 == 0) &&
     (local_2f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    std::__cxx11::string::_M_assign((string *)&local_318);
  }
  this_00 = &local_350->StateSnapshot;
  pcVar7 = cmState::Snapshot::GetCurrentBinaryDirectory(this_00);
  std::__cxx11::string::string((string *)&local_2b8,pcVar7,(allocator *)local_278);
  pcVar7 = cmState::GetBinaryDirectory(local_350->GlobalGenerator->CMakeInstance->State);
  std::__cxx11::string::string((string *)&local_2d8,pcVar7,(allocator *)local_278);
  if (local_2b0 == local_2d0) {
    uVar13 = (undefined7)((ulong)unaff_RBP >> 8);
    if (local_2b0 == 0) {
      uVar11 = (undefined4)CONCAT71(uVar13,1);
    }
    else {
      iVar6 = bcmp(local_2b8,local_2d8,local_2b0);
      uVar11 = (undefined4)CONCAT71(uVar13,iVar6 == 0);
    }
  }
  else {
    uVar11 = 0;
  }
  std::__cxx11::string::append((char *)&local_2b8);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(char *)local_2b8,false);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_278,true);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"# Install script for directory: ",0x20);
  pcVar7 = cmState::Snapshot::GetCurrentSourceDirectory(this_00);
  if (pcVar7 == (char *)0x0) {
    std::ios::clear((int)auStack_358 + (int)*(undefined8 *)(local_278._0_8_ + -0x18) + 0xe0);
  }
  else {
    sVar8 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar7,sVar8);
  }
  std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18));
  std::ostream::put((char)local_278);
  plVar9 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
  std::ostream::put((char)plVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"# Set the install prefix",0x18);
  std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18));
  std::ostream::put((char)local_278);
  poVar10 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,"if(NOT DEFINED CMAKE_INSTALL_PREFIX)",0x24);
  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
  std::ostream::put((char)poVar10);
  poVar10 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  set(CMAKE_INSTALL_PREFIX \"",0x1c);
  pcVar7 = local_320;
  sVar8 = strlen(local_320);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar7,sVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\")",2);
  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
  std::ostream::put((char)poVar10);
  poVar10 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"endif()",7);
  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
  std::ostream::put((char)poVar10);
  poVar10 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,"string(REGEX REPLACE \"/$\" \"\" CMAKE_INSTALL_PREFIX ",0x32);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"${CMAKE_INSTALL_PREFIX}\")",0x1a);
  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
  std::ostream::put((char)poVar10);
  plVar9 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
  std::ostream::put((char)plVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "# Set the install configuration name.\nif(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n  if(BUILD_TYPE)\n    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n  else()\n    set(CMAKE_INSTALL_CONFIG_NAME \""
             ,0xf1);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_278,(char *)local_318,local_310);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,
             "\")\n  endif()\n  message(STATUS \"Install configuration: \\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\nendif()\n\n"
             ,0x62);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "# Set the component getting installed.\nif(NOT CMAKE_INSTALL_COMPONENT)\n  if(COMPONENT)\n    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n  else()\n    set(CMAKE_INSTALL_COMPONENT)\n  endif()\nendif()\n\n"
             ,0xfe);
  pcVar3 = local_350->Makefile;
  paVar1 = &local_340.field_2;
  local_340._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"CMAKE_INSTALL_SO_NO_EXE","")
  ;
  pcVar7 = cmMakefile::GetDefinition(pcVar3,&local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != paVar1) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  local_320 = (char *)CONCAT44(local_320._4_4_,uVar11);
  if (pcVar7 != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "# Install shared libraries without execute permission?\nif(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n  set(CMAKE_INSTALL_SO_NO_EXE \""
               ,0x7e);
    sVar8 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar7,sVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\")\nendif()\n\n",0xc);
  }
  pcVar3 = local_350->Makefile;
  ppcVar12 = (pcVar3->InstallGenerators).
             super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if (ppcVar12 !=
      (pcVar3->InstallGenerators).
      super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      cmScriptGenerator::Generate
                (&(*ppcVar12)->super_cmScriptGenerator,(ostream *)local_278,&local_298,&local_2f8);
      ppcVar12 = ppcVar12 + 1;
    } while (ppcVar12 !=
             (pcVar3->InstallGenerators).
             super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  GenerateTargetInstallRules(local_350,(ostream *)local_278,&local_298,&local_2f8);
  if ((local_350->Children).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (local_350->Children).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"  # Include the install script for each subdirectory.\n",0x36);
    ppcVar16 = (local_350->Children).
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppcVar16 !=
        (local_350->Children).
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pcVar3 = (*ppcVar16)->Makefile;
        local_340._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"EXCLUDE_FROM_ALL","");
        bVar5 = cmMakefile::GetPropertyAsBool(pcVar3,&local_340);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != paVar1) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
        if (!bVar5) {
          pcVar7 = cmMakefile::GetCurrentBinaryDirectory((*ppcVar16)->Makefile);
          std::__cxx11::string::string((string *)&local_340,pcVar7,&local_341);
          cmsys::SystemTools::ConvertToUnixSlashes(&local_340);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_278,"  include(\"",0xb);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_278,local_340._M_dataplus._M_p,
                               local_340._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"/cmake_install.cmake\")",0x16)
          ;
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != paVar1) {
            operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
          }
        }
        ppcVar16 = ppcVar16 + 1;
      } while (ppcVar16 !=
               (local_350->Children).
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"endif()\n\n",9);
  }
  if ((char)local_320 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "if(CMAKE_INSTALL_COMPONENT)\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest_${CMAKE_INSTALL_COMPONENT}.txt\")\nelse()\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\nendif()\n\nstring(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\nfile(WRITE \""
               ,0x11e);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_278,(char *)local_2d8,local_2d0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"/${CMAKE_INSTALL_MANIFEST}\"\n     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n"
               ,0x46);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8,local_2c8[0] + 1);
  }
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8,local_2a8[0] + 1);
  }
  if (local_318 != local_308) {
    operator_delete(local_318,local_308[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2f8);
  return;
}

Assistant:

void cmLocalGenerator::GenerateInstallRules()
{
  // Compute the install prefix.
  const char* prefix = this->Makefile->GetDefinition("CMAKE_INSTALL_PREFIX");
#if defined(_WIN32) && !defined(__CYGWIN__)
  std::string prefix_win32;
  if(!prefix)
    {
    if(!cmSystemTools::GetEnv("SystemDrive", prefix_win32))
      {
      prefix_win32 = "C:";
      }
    const char* project_name = this->Makefile->GetDefinition("PROJECT_NAME");
    if(project_name && project_name[0])
      {
      prefix_win32 += "/Program Files/";
      prefix_win32 += project_name;
      }
    else
      {
      prefix_win32 += "/InstalledCMakeProject";
      }
    prefix = prefix_win32.c_str();
    }
#elif defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (!prefix)
    {
    if (find_directory(B_SYSTEM_DIRECTORY, -1, false, dir, sizeof(dir))
        == B_OK)
      {
      prefix = dir;
      }
    else
      {
      prefix = "/boot/system";
      }
    }
#else
  if (!prefix)
    {
    prefix = "/usr/local";
    }
#endif
  if (const char *stagingPrefix
                  = this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX"))
    {
    prefix = stagingPrefix;
    }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes;
  const std::string& config =
    this->Makefile->GetConfigurations(configurationTypes, false);

  // Choose a default install configuration.
  std::string default_config = config;
  const char* default_order[] = {"RELEASE", "MINSIZEREL",
                                 "RELWITHDEBINFO", "DEBUG", 0};
  for(const char** c = default_order; *c && default_config.empty(); ++c)
    {
    for(std::vector<std::string>::iterator i = configurationTypes.begin();
        i != configurationTypes.end(); ++i)
      {
      if(cmSystemTools::UpperCase(*i) == *c)
        {
        default_config = *i;
        }
      }
    }
  if(default_config.empty() && !configurationTypes.empty())
    {
    default_config = configurationTypes[0];
    }

  // Create the install script file.
  std::string file = this->StateSnapshot.GetCurrentBinaryDirectory();
  std::string homedir = this->GetState()->GetBinaryDirectory();
  int toplevel_install = 0;
  if (file == homedir)
    {
    toplevel_install = 1;
    }
  file += "/cmake_install.cmake";
  cmGeneratedFileStream fout(file.c_str());
  fout.SetCopyIfDifferent(true);

  // Write the header.
  fout << "# Install script for directory: "
       << this->StateSnapshot.GetCurrentSourceDirectory()
       << std::endl << std::endl;
  fout << "# Set the install prefix" << std::endl
       << "if(NOT DEFINED CMAKE_INSTALL_PREFIX)" << std::endl
       << "  set(CMAKE_INSTALL_PREFIX \"" << prefix << "\")" << std::endl
       << "endif()" << std::endl
       << "string(REGEX REPLACE \"/$\" \"\" CMAKE_INSTALL_PREFIX "
       << "\"${CMAKE_INSTALL_PREFIX}\")" << std::endl
       << std::endl;

  // Write support code for generating per-configuration install rules.
  fout <<
    "# Set the install configuration name.\n"
    "if(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n"
    "  if(BUILD_TYPE)\n"
    "    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n"
    "           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_CONFIG_NAME \"" << default_config << "\")\n"
    "  endif()\n"
    "  message(STATUS \"Install configuration: "
    "\\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\n"
    "endif()\n"
    "\n";

  // Write support code for dealing with component-specific installs.
  fout <<
    "# Set the component getting installed.\n"
    "if(NOT CMAKE_INSTALL_COMPONENT)\n"
    "  if(COMPONENT)\n"
    "    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n"
    "    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_COMPONENT)\n"
    "  endif()\n"
    "endif()\n"
    "\n";

  // Copy user-specified install options to the install code.
  if(const char* so_no_exe =
     this->Makefile->GetDefinition("CMAKE_INSTALL_SO_NO_EXE"))
    {
    fout <<
      "# Install shared libraries without execute permission?\n"
      "if(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n"
      "  set(CMAKE_INSTALL_SO_NO_EXE \"" << so_no_exe << "\")\n"
      "endif()\n"
      "\n";
    }

  // Ask each install generator to write its code.
  std::vector<cmInstallGenerator*> const& installers =
    this->Makefile->GetInstallGenerators();
  for(std::vector<cmInstallGenerator*>::const_iterator
        gi = installers.begin();
      gi != installers.end(); ++gi)
    {
    (*gi)->Generate(fout, config, configurationTypes);
    }

  // Write rules from old-style specification stored in targets.
  this->GenerateTargetInstallRules(fout, config, configurationTypes);

  // Include install scripts from subdirectories.
  if(!this->Children.empty())
    {
    fout << "if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n";
    fout << "  # Include the install script for each subdirectory.\n";
    for(std::vector<cmLocalGenerator*>::const_iterator
          ci = this->Children.begin(); ci != this->Children.end(); ++ci)
      {
      if(!(*ci)->GetMakefile()->GetPropertyAsBool("EXCLUDE_FROM_ALL"))
        {
        std::string odir = (*ci)->GetMakefile()->GetCurrentBinaryDirectory();
        cmSystemTools::ConvertToUnixSlashes(odir);
        fout << "  include(\"" <<  odir
             << "/cmake_install.cmake\")" << std::endl;
        }
      }
    fout << "\n";
    fout << "endif()\n\n";
    }

  // Record the install manifest.
  if ( toplevel_install )
    {
    fout <<
      "if(CMAKE_INSTALL_COMPONENT)\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest_"
      "${CMAKE_INSTALL_COMPONENT}.txt\")\n"
      "else()\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\n"
      "endif()\n"
      "\n"
      "string(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n"
      "       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\n"
      "file(WRITE \"" << homedir << "/${CMAKE_INSTALL_MANIFEST}\"\n"
      "     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n";
    }
}